

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall host_array_front_Test::host_array_front_Test(host_array_front_Test *this)

{
  host_array_front_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__host_array_front_Test_0019fac0;
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, back)
{
   camp::array<int, 2> a = {1, 8};

   bool passed = a[0] == 1 &&
                 a[1] == 8 &&
                 a.back() == 8;

   a.back() = 3;

   return passed &&
          a[0] == 1 &&
          a[1] == 3 &&
          a.back() == 3;
}